

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.h
# Opt level: O1

void __thiscall DataSourceBase::~DataSourceBase(DataSourceBase *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_00157868;
  std::
  vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  ::~vector(&this->animation_table);
  pcVar1 = (this->path)._M_dataplus._M_p;
  paVar2 = &(this->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~DataSourceBase() {}